

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDecoder.cpp
# Opt level: O2

DecoderResult * ZXing::DataMatrix::DoDecode(DecoderResult *__return_storage_ptr__,BitMatrix *bits)

{
  pointer puVar1;
  pointer puVar2;
  undefined3 uVar3;
  bool fix259;
  SymbologyIdentifier SVar4;
  bool bVar5;
  byte val;
  uint8_t uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  const_iterator __begin0;
  Version *version;
  pointer pDVar14;
  ulong uVar15;
  ulong uVar16;
  GenericGF *field;
  ulong uVar17;
  undefined1 *puVar18;
  long *plVar19;
  bool bVar20;
  char cVar21;
  const_iterator __end0;
  long lVar23;
  bool bVar24;
  char cVar25;
  int iVar26;
  char *pcVar27;
  allocator<char> local_5e9;
  BitSource bits_1;
  Content result;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_570;
  size_type local_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_560;
  uint *local_550;
  long local_548;
  uint local_540;
  undefined4 uStack_53c;
  undefined4 uStack_538;
  undefined4 uStack_534;
  uint *local_530;
  long local_528;
  uint local_520;
  undefined4 uStack_51c;
  undefined4 uStack_518;
  undefined4 uStack_514;
  uint *local_510;
  long local_508;
  uint local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  uint *local_4f0;
  long local_4e8;
  uint local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  uint *local_4d0;
  long local_4c8;
  uint local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> dataBlocks;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_498;
  size_type local_490;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_478;
  size_type local_470;
  char local_468 [8];
  undefined8 uStack_460;
  uint *local_458;
  long local_450;
  uint local_448;
  undefined4 uStack_444;
  undefined4 uStack_440;
  undefined4 uStack_43c;
  uint *local_438;
  long local_430;
  uint local_428;
  undefined4 uStack_424;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  uint *local_418;
  long local_410;
  uint local_408;
  undefined4 uStack_404;
  undefined4 uStack_400;
  undefined4 uStack_3fc;
  uint *local_3f8;
  long local_3f0;
  uint local_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  uint *local_3d8;
  long local_3d0;
  uint local_3c8;
  undefined4 uStack_3c4;
  undefined4 uStack_3c0;
  undefined4 uStack_3bc;
  uint *local_3b8;
  long local_3b0;
  uint local_3a8;
  undefined4 uStack_3a4;
  undefined4 uStack_3a0;
  undefined4 uStack_39c;
  StructuredAppendInfo sai;
  Error local_370;
  string resultTrailer;
  undefined1 *local_320;
  undefined8 local_318;
  undefined1 local_310;
  uint7 uStack_30f;
  undefined8 uStack_308;
  ByteArray resultBytes;
  Error error;
  optional<std::array<int,_3UL>_> triple;
  optional<std::array<int,_3UL>_> triple_1;
  Error local_298;
  ByteArray codewords;
  vector<int,_std::allocator<int>_> codewordsInts;
  StructuredAppendInfo local_1f0;
  bool local_1c7;
  Error local_1c0;
  Error local_180;
  Error local_150;
  string local_120;
  DecoderResult local_100;
  uint uVar22;
  
  version = VersionForDimensionsOf<ZXing::BitMatrix>(bits);
  if (version == (Version *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_478,"Invalid matrix dimension",(allocator<char> *)&codewordsInts);
    local_150._msg._M_dataplus._M_p = (pointer)&local_150._msg.field_2;
    if (local_478 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468) {
      local_150._msg.field_2._8_8_ = uStack_460;
    }
    else {
      local_150._msg._M_dataplus._M_p = (pointer)local_478;
    }
    local_150._msg._M_string_length = local_470;
    local_470 = 0;
    local_468[0] = '\0';
    local_150._file = "src/datamatrix/DMDecoder.cpp";
    local_150._line = 0x188;
    local_150._type = Format;
    local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_468;
    DecoderResult::DecoderResult(__return_storage_ptr__,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_478);
  }
  else {
    CodewordsFromBitMatrix(&codewords,bits,version);
    if (codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        codewords.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_498,"Invalid number of code words",
                 (allocator<char> *)&codewordsInts);
      local_180._msg._M_dataplus._M_p = (pointer)&local_180._msg.field_2;
      if (local_498 == &local_488) {
        local_180._msg.field_2._8_8_ = local_488._8_8_;
      }
      else {
        local_180._msg._M_dataplus._M_p = (pointer)local_498;
      }
      local_180._msg._M_string_length = local_490;
      local_490 = 0;
      local_488._M_local_buf[0] = '\0';
      local_180._file = "src/datamatrix/DMDecoder.cpp";
      local_180._line = 0x18d;
      local_180._type = Format;
      local_498 = &local_488;
      DecoderResult::DecoderResult(__return_storage_ptr__,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_498);
    }
    else {
      fix259 = false;
      do {
        GetDataBlocks(&dataBlocks,&codewords,version,fix259);
        if (dataBlocks.
            super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            dataBlocks.
            super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          iVar26 = 0;
          for (pDVar14 = dataBlocks.
                         super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pDVar14 !=
              dataBlocks.
              super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
              ._M_impl.super__Vector_impl_data._M_finish; pDVar14 = pDVar14 + 1) {
            iVar26 = iVar26 + pDVar14->numDataCodewords;
          }
          ByteArray::ByteArray(&resultBytes,iVar26);
          uVar15 = (ulong)((long)dataBlocks.
                                 super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)dataBlocks.
                                super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 5;
          iVar26 = (int)uVar15;
          uVar16 = 0;
          if (0 < iVar26) {
            uVar16 = uVar15 & 0xffffffff;
          }
          uVar15 = 0;
LAB_001638bb:
          pDVar14 = dataBlocks.
                    super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (uVar15 != uVar16) {
            iVar12 = dataBlocks.
                     super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].numDataCodewords;
            std::vector<int,std::allocator<int>>::
            vector<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                      ((vector<int,std::allocator<int>> *)&codewordsInts,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )dataBlocks.
                         super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar15].codewords.
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )dataBlocks.
                         super__Vector_base<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar15].codewords.
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish,(allocator_type *)&local_100);
            pDVar14 = pDVar14 + uVar15;
            puVar1 = (pDVar14->codewords).
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar2 = (pDVar14->codewords).
                     super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            field = GenericGF::DataMatrixField256();
            bVar5 = ReedSolomonDecode(field,&codewordsInts,((int)puVar2 - (int)puVar1) - iVar12);
            if (bVar5) goto code_r0x00163929;
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&codewordsInts.super__Vector_base<int,_std::allocator<int>_>);
            bVar5 = true;
            bVar24 = true;
            if (version->versionNumber != 0x18 || fix259) {
              local_298._msg._M_dataplus._M_p = (pointer)&local_298._msg.field_2;
              local_320 = &local_310;
              local_298._msg.field_2._M_allocated_capacity = (ulong)uStack_30f << 8;
              local_298._msg.field_2._8_8_ = uStack_308;
              local_298._msg._M_string_length = 0;
              local_318 = 0;
              local_310 = 0;
              local_298._file = "src/datamatrix/DMDecoder.cpp";
              local_298._line = 0x1a2;
              local_298._type = Checksum;
              DecoderResult::DecoderResult(__return_storage_ptr__,&local_298);
              std::__cxx11::string::~string((string *)&local_298);
              std::__cxx11::string::~string((string *)&local_320);
LAB_00164ce1:
              bVar5 = false;
              bVar24 = fix259;
            }
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&resultBytes);
            fix259 = bVar24;
            goto LAB_00164d1e;
          }
          iVar26 = version->versionNumber;
          bits_1._bytes = &resultBytes;
          bits_1._byteOffset = 0;
          bits_1._bitOffset = 0;
          Content::Content(&result);
          error._msg._M_dataplus._M_p = (pointer)&error._msg.field_2;
          error._msg._M_string_length = 0;
          uVar11 = 0;
          error._msg.field_2._M_local_buf[0] = '\0';
          error._file = (char *)0x0;
          error._line = -1;
          error._type = None;
          result.symbology.code = 'd';
          result.symbology.modifier = '1';
          result.symbology.eciModifierOffset = '\x03';
          result.symbology.aiFlag = None;
          resultTrailer._M_dataplus._M_p = (pointer)&resultTrailer.field_2;
          resultTrailer._M_string_length = 0;
          resultTrailer.field_2._M_local_buf[0] = '\0';
          sai.index = -1;
          sai.count = -1;
          sai.id._M_dataplus._M_p = (pointer)&sai.id.field_2;
          sai.id._M_string_length = 0;
          sai.id.field_2._M_local_buf[0] = '\0';
          bVar5 = true;
          cVar21 = '\0';
          iVar12 = 1;
LAB_00163aa7:
          bVar24 = false;
LAB_00163aaf:
          uVar22 = uVar11;
          bVar20 = SUB41(uVar22,0);
          if ((bVar24) || (iVar7 = BitSource::available(&bits_1), iVar7 < 8)) {
            Content::append(&result,&resultTrailer);
            SVar4 = result.symbology;
            cVar25 = result.symbology.modifier;
            bVar5 = result.symbology.modifier == '2';
            result.symbology.aiFlag = bVar5;
            cVar21 = '\0';
            if (iVar26 - 0x1fU < 0x12) {
              cVar21 = '\x06';
            }
            result.symbology.code = SVar4.code;
            result.symbology.modifier = cVar21 + cVar25;
            DecoderResult::DecoderResult((DecoderResult *)&codewordsInts,&result);
            Error::operator=(&local_1c0,&error);
            StructuredAppendInfo::operator=(&local_1f0,&sai);
            local_1c7 = bVar20;
            DecoderResult::DecoderResult(&local_100,(DecoderResult *)&codewordsInts);
            DecoderResult::~DecoderResult((DecoderResult *)&codewordsInts);
            std::__cxx11::string::~string((string *)&sai.id);
            std::__cxx11::string::~string((string *)&resultTrailer);
            std::__cxx11::string::~string((string *)&error);
            Content::~Content(&result);
            local_100._versionNumber = version->versionNumber;
            DecoderResult::DecoderResult(__return_storage_ptr__,&local_100);
            DecoderResult::~DecoderResult(&local_100);
            goto LAB_00164ce1;
          }
          uVar8 = BitSource::readBits(&bits_1,8);
          uVar3 = (undefined3)(uVar8 - 0xe6 >> 8);
          iVar7 = bits_1._byteOffset;
          switch(uVar8 - 0xe6) {
          case 0:
            goto switchD_00163af9_caseD_e6;
          case 1:
            iVar9 = BitSource::readBits(&bits_1,8);
            iVar13 = iVar7 + 2;
            uVar11 = iVar9 + ~((iVar7 * 0x95 + 0x95) % 0xff);
            iVar9 = (uVar11 >> 0x17 & 0x100) + uVar11;
            if (iVar9 == 0) {
              iVar9 = BitSource::available(&bits_1);
              iVar9 = iVar9 / 8;
            }
            else if (0xf9 < iVar9) {
              iVar10 = BitSource::readBits(&bits_1,8);
              uVar11 = iVar10 + ~((iVar13 * 0x95) % 0xff);
              iVar9 = (uVar11 >> 0x17 & 0x100) + iVar9 * 0xfa + uVar11 + -0xf32a;
              iVar13 = iVar7 + 3;
            }
            if (iVar9 < 0) {
              plVar19 = (long *)__cxa_allocate_exception(0x30);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_4d0,"invalid count in Base256 segment",
                         (allocator<char> *)&codewordsInts);
              *plVar19 = (long)(plVar19 + 2);
              if (local_4d0 == &local_4c0) {
                *(uint *)(plVar19 + 2) = local_4c0;
                *(undefined4 *)((long)plVar19 + 0x14) = uStack_4bc;
                *(undefined4 *)(plVar19 + 3) = uStack_4b8;
                *(undefined4 *)((long)plVar19 + 0x1c) = uStack_4b4;
              }
              else {
                *plVar19 = (long)local_4d0;
                plVar19[2] = CONCAT44(uStack_4bc,local_4c0);
              }
              plVar19[1] = local_4c8;
              local_4d0 = &local_4c0;
              local_4c8 = 0;
              local_4c0 = local_4c0 & 0xffffff00;
              plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
              *(undefined2 *)(plVar19 + 5) = 0x106;
              *(undefined1 *)((long)plVar19 + 0x2a) = 1;
              __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
            }
            Content::reserve(&result,iVar9);
            iVar13 = iVar13 * 0x95;
            while (bVar5 = iVar9 != 0, iVar9 = iVar9 + -1, bVar5) {
              iVar7 = BitSource::readBits(&bits_1,8);
              Content::push_back(&result,(char)iVar7 + ~(byte)(iVar13 % 0xff));
              iVar13 = iVar13 + 0x95;
            }
            break;
          case 2:
            if (bits_1._byteOffset == iVar12) {
              result.symbology.modifier = '2';
            }
            else {
              if (bits_1._byteOffset != iVar12 + 1) {
                bVar24 = false;
                Content::push_back(&result,'\x1d');
                bVar5 = false;
                uVar11 = uVar22 & 0xff;
                goto LAB_00163aaf;
              }
              result.symbology.modifier = '3';
            }
            break;
          case 3:
            if (!bVar5) {
              plVar19 = (long *)__cxa_allocate_exception(0x30);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_510,"structured append tag must be first code word",
                         (allocator<char> *)&codewordsInts);
              *plVar19 = (long)(plVar19 + 2);
              if (local_510 == &local_500) {
                *(uint *)(plVar19 + 2) = local_500;
                *(undefined4 *)((long)plVar19 + 0x14) = uStack_4fc;
                *(undefined4 *)(plVar19 + 3) = uStack_4f8;
                *(undefined4 *)((long)plVar19 + 0x1c) = uStack_4f4;
              }
              else {
                *plVar19 = (long)local_510;
                plVar19[2] = CONCAT44(uStack_4fc,local_500);
              }
              plVar19[1] = local_508;
              local_510 = &local_500;
              local_508 = 0;
              local_500 = local_500 & 0xffffff00;
              plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
              *(undefined2 *)(plVar19 + 5) = 0x136;
              *(undefined1 *)((long)plVar19 + 0x2a) = 1;
              __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
            }
            uVar11 = BitSource::readBits(&bits_1,8);
            sai.count = 0x11 - (uVar11 & 0xf);
            if (sai.count <= (int)uVar11 >> 4) {
              sai.count = 0;
            }
            if ((uVar11 & 0xf) == 0) {
              sai.count = 0;
            }
            sai.index = (int)uVar11 >> 4;
            iVar12 = BitSource::readBits(&bits_1,8);
            uVar11 = BitSource::readBits(&bits_1,8);
            std::__cxx11::to_string(&local_120,uVar11 | iVar12 << 8);
            std::__cxx11::string::operator=((string *)&sai.id,(string *)&local_120);
            std::__cxx11::string::~string((string *)&local_120);
            bVar24 = false;
            iVar12 = 5;
            bVar5 = false;
            uVar11 = uVar22 & 0xff;
            goto LAB_00163aaf;
          case 4:
            bVar24 = false;
            bVar20 = !bVar5;
            uVar11 = 1;
            bVar5 = false;
            if (bVar20) {
              plVar19 = (long *)__cxa_allocate_exception(0x30);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_530,"reader programming tag must be first code word",
                         (allocator<char> *)&codewordsInts);
              *plVar19 = (long)(plVar19 + 2);
              if (local_530 == &local_520) {
                *(uint *)(plVar19 + 2) = local_520;
                *(undefined4 *)((long)plVar19 + 0x14) = uStack_51c;
                *(undefined4 *)(plVar19 + 3) = uStack_518;
                *(undefined4 *)((long)plVar19 + 0x1c) = uStack_514;
              }
              else {
                *plVar19 = (long)local_530;
                plVar19[2] = CONCAT44(uStack_51c,local_520);
              }
              plVar19[1] = local_528;
              local_530 = &local_520;
              local_528 = 0;
              local_520 = local_520 & 0xffffff00;
              plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
              *(undefined2 *)(plVar19 + 5) = 0x13c;
              *(undefined1 *)((long)plVar19 + 0x2a) = 1;
              __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
            }
            goto LAB_00163aaf;
          case 5:
            cVar21 = '\x01';
            break;
          case 6:
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&codewordsInts,"[)>\x1e05\x1d",&local_5e9);
            Content::append(&result,(string *)&codewordsInts);
            goto LAB_00163d69;
          case 7:
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&codewordsInts,"[)>\x1e06\x1d",&local_5e9);
            Content::append(&result,(string *)&codewordsInts);
LAB_00163d69:
            std::__cxx11::string::~string((string *)&codewordsInts);
            bVar24 = false;
            std::__cxx11::string::insert((ulong)&resultTrailer,(char *)0x0);
            uVar11 = uVar22 & 0xff;
            bVar5 = false;
            goto LAB_00163aaf;
          case 8:
            while( true ) {
              triple = DecodedBitStreamParser::DecodeNextTriple(&bits_1);
              if (((undefined1  [16])
                   triple.super__Optional_base<std::array<int,_3UL>,_true,_true>._M_payload.
                   super__Optional_payload_base<std::array<int,_3UL>_> &
                  (undefined1  [16])0x100000000) == (undefined1  [16])0x0) break;
              for (lVar23 = 0; lVar23 != 0xc; lVar23 = lVar23 + 4) {
                uVar11 = *(uint *)((long)&triple.
                                          super__Optional_base<std::array<int,_3UL>,_true,_true>.
                                          _M_payload.
                                          super__Optional_payload_base<std::array<int,_3UL>_>.
                                          _M_payload + lVar23);
                if ((long)(int)uVar11 < 0) {
                  plVar19 = (long *)__cxa_allocate_exception(0x30);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_438,"invalid value in AnsiX12 segment",
                             (allocator<char> *)&codewordsInts);
                  *plVar19 = (long)(plVar19 + 2);
                  if (local_438 == &local_428) {
                    *(uint *)(plVar19 + 2) = local_428;
                    *(undefined4 *)((long)plVar19 + 0x14) = uStack_424;
                    *(undefined4 *)(plVar19 + 3) = uStack_420;
                    *(undefined4 *)((long)plVar19 + 0x1c) = uStack_41c;
                  }
                  else {
                    *plVar19 = (long)local_438;
                    plVar19[2] = CONCAT44(uStack_424,local_428);
                  }
                  plVar19[1] = local_430;
                  local_430 = 0;
                  local_428 = local_428 & 0xffffff00;
                  plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
                  *(undefined2 *)(plVar19 + 5) = 0xc4;
                  *(undefined1 *)((long)plVar19 + 0x2a) = 1;
                  local_438 = &local_428;
                  __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
                }
                if (uVar11 < 4) {
                  uVar6 = *(uint8_t *)
                           ((long)&DecodedBitStreamParser::
                                   DecodeAnsiX12Segment(ZXing::BitSource&,ZXing::Content&)::segChars
                           + (long)(int)uVar11);
                }
                else if (uVar11 < 0xe) {
                  uVar6 = (char)uVar11 + ',';
                }
                else {
                  if (0x27 < uVar11) {
                    plVar19 = (long *)__cxa_allocate_exception(0x30);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_458,"invalid value in AnsiX12 segment",
                               (allocator<char> *)&codewordsInts);
                    *plVar19 = (long)(plVar19 + 2);
                    if (local_458 == &local_448) {
                      *(uint *)(plVar19 + 2) = local_448;
                      *(undefined4 *)((long)plVar19 + 0x14) = uStack_444;
                      *(undefined4 *)(plVar19 + 3) = uStack_440;
                      *(undefined4 *)((long)plVar19 + 0x1c) = uStack_43c;
                    }
                    else {
                      *plVar19 = (long)local_458;
                      plVar19[2] = CONCAT44(uStack_444,local_448);
                    }
                    plVar19[1] = local_450;
                    local_450 = 0;
                    local_448 = local_448 & 0xffffff00;
                    plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
                    *(undefined2 *)(plVar19 + 5) = 0xcc;
                    *(undefined1 *)((long)plVar19 + 0x2a) = 1;
                    local_458 = &local_448;
                    __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
                  }
                  uVar6 = (char)uVar11 + '3';
                }
                Content::push_back(&result,uVar6);
              }
            }
            break;
          case 9:
            bVar5 = false;
            pcVar27 = "*** 0123456789abcdefghijklmnopqrstuvwxyz";
            goto LAB_00163ffe;
          case 10:
            while (iVar7 = BitSource::available(&bits_1), 0x17 < iVar7) {
              iVar7 = 4;
              while (bVar5 = iVar7 != 0, iVar7 = iVar7 + -1, bVar5) {
                uVar11 = BitSource::readBits(&bits_1,6);
                val = (byte)uVar11;
                if (val == 0x1f) {
                  bVar24 = false;
                  uVar11 = uVar22 & 0xff;
                  bVar5 = false;
                  if (bits_1._bitOffset != 0) {
                    bVar24 = false;
                    BitSource::readBits(&bits_1,8 - bits_1._bitOffset);
                    uVar11 = uVar22 & 0xff;
                    bVar5 = false;
                  }
                  goto LAB_00163aaf;
                }
                if ((uVar11 & 0x20) == 0) {
                  val = val | 0x40;
                }
                Content::push_back(&result,val);
              }
            }
            break;
          case 0xb:
            uVar11 = BitSource::readBits(&bits_1,8);
            if (0x7f < (int)uVar11) {
              iVar7 = BitSource::readBits(&bits_1,8);
              if (uVar11 < 0xc0) {
                uVar11 = (uVar11 * 0xfe + iVar7) - 0x7e81;
              }
              else {
                iVar13 = BitSource::readBits(&bits_1,8);
                uVar11 = (iVar13 + iVar7 * 0xfe + uVar11 * 0xfc04) - 0xbcc3ff;
              }
            }
            bVar24 = false;
            Content::switchEncoding(&result,uVar11 + Unknown);
            uVar11 = uVar22 & 0xff;
            bVar5 = false;
            goto LAB_00163aaf;
          default:
            goto switchD_00163af9_default;
          }
          goto LAB_00163ed2;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_570,"Invalid number of data blocks",
                   (allocator<char> *)&codewordsInts);
        if (local_570 == &local_560) {
          local_370._msg.field_2._8_8_ = local_560._8_8_;
          local_370._msg._M_dataplus._M_p = (pointer)&local_370._msg.field_2;
        }
        else {
          local_370._msg._M_dataplus._M_p = (pointer)local_570;
        }
        local_370._msg.field_2._M_allocated_capacity._1_7_ = local_560._M_allocated_capacity._1_7_;
        local_370._msg.field_2._M_local_buf[0] = local_560._M_local_buf[0];
        local_370._msg._M_string_length = local_568;
        local_568 = 0;
        local_560._M_local_buf[0] = '\0';
        local_370._file = "src/datamatrix/DMDecoder.cpp";
        local_370._line = 0x194;
        local_370._type = Format;
        local_570 = &local_560;
        DecoderResult::DecoderResult(__return_storage_ptr__,&local_370);
        std::__cxx11::string::~string((string *)&local_370);
        std::__cxx11::string::~string((string *)&local_570);
        bVar5 = false;
LAB_00164d1e:
        std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::
        ~vector(&dataBlocks);
      } while (bVar5);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&codewords);
  }
  return __return_storage_ptr__;
code_r0x00163929:
  std::
  copy_n<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             codewordsInts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start,iVar12,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )(pDVar14->codewords).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&codewordsInts.super__Vector_base<int,_std::allocator<int>_>);
  uVar17 = uVar15;
  for (lVar23 = 0; lVar23 < pDVar14->numDataCodewords; lVar23 = lVar23 + 1) {
    resultBytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar17] =
         (pDVar14->codewords).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start[lVar23];
    uVar17 = uVar17 + (long)iVar26;
  }
  uVar15 = uVar15 + 1;
  goto LAB_001638bb;
switchD_00163af9_default:
  bVar24 = true;
  uVar11 = CONCAT31(uVar3,bVar20);
  bVar5 = false;
  if (uVar8 == 0x81) goto LAB_00163aaf;
  if (uVar8 == 0) {
    plVar19 = (long *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4f0,"invalid 0 code word",(allocator<char> *)&codewordsInts);
    *plVar19 = (long)(plVar19 + 2);
    if (local_4f0 == &local_4e0) {
      *(uint *)(plVar19 + 2) = local_4e0;
      *(undefined4 *)((long)plVar19 + 0x14) = uStack_4dc;
      *(undefined4 *)(plVar19 + 3) = uStack_4d8;
      *(undefined4 *)((long)plVar19 + 0x1c) = uStack_4d4;
    }
    else {
      *plVar19 = (long)local_4f0;
      plVar19[2] = CONCAT44(uStack_4dc,local_4e0);
    }
    plVar19[1] = local_4e8;
    local_4f0 = &local_4e0;
    local_4e8 = 0;
    local_4e0 = local_4e0 & 0xffffff00;
    plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
    *(undefined2 *)(plVar19 + 5) = 0x125;
    *(undefined1 *)((long)plVar19 + 0x2a) = 1;
    __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
  }
  if ((int)uVar8 < 0x81) {
    cVar25 = cVar21 * -0x80;
    cVar21 = '\0';
    Content::push_back(&result,(char)uVar8 + cVar25 + 0xff);
    bVar24 = false;
    uVar11 = uVar22 & 0xff;
    bVar5 = false;
    goto LAB_00163aaf;
  }
  if (0xe5 < uVar8) {
    bVar24 = false;
    uVar11 = CONCAT31(uVar3,bVar20);
    bVar5 = false;
    if (0xf1 < uVar8) {
      if (uVar8 == 0xfe) {
        iVar7 = BitSource::available(&bits_1);
        bVar24 = false;
        uVar11 = uVar22 & 0xff;
        bVar5 = false;
        if (iVar7 == 0) goto LAB_00163aaf;
      }
      plVar19 = (long *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_550,"invalid code word",(allocator<char> *)&codewordsInts);
      *plVar19 = (long)(plVar19 + 2);
      if (local_550 == &local_540) {
        *(uint *)(plVar19 + 2) = local_540;
        *(undefined4 *)((long)plVar19 + 0x14) = uStack_53c;
        *(undefined4 *)(plVar19 + 3) = uStack_538;
        *(undefined4 *)((long)plVar19 + 0x1c) = uStack_534;
      }
      else {
        *plVar19 = (long)local_550;
        plVar19[2] = CONCAT44(uStack_53c,local_540);
      }
      plVar19[1] = local_548;
      local_550 = &local_540;
      local_548 = 0;
      local_540 = local_540 & 0xffffff00;
      plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
      *(undefined2 *)(plVar19 + 5) = 0x155;
      *(undefined1 *)((long)plVar19 + 0x2a) = 1;
      __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
    }
    goto LAB_00163aaf;
  }
  ToString<int,void>((string *)&codewordsInts,(ZXing *)(ulong)(uVar8 - 0x82),2,uVar11);
  Content::append(&result,(string *)&codewordsInts);
  std::__cxx11::string::~string((string *)&codewordsInts);
LAB_00163ed2:
  bVar24 = false;
  uVar11 = uVar22 & 0xff;
  bVar5 = false;
  goto LAB_00163aaf;
switchD_00163af9_caseD_e6:
  bVar5 = true;
  pcVar27 = "*** 0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
LAB_00163ffe:
  uVar11 = 0;
  cVar25 = '\0';
  while( true ) {
    triple_1 = DecodedBitStreamParser::DecodeNextTriple(&bits_1);
    if (((undefined1  [16])
         triple_1.super__Optional_base<std::array<int,_3UL>,_true,_true>._M_payload.
         super__Optional_payload_base<std::array<int,_3UL>_> & (undefined1  [16])0x100000000) ==
        (undefined1  [16])0x0) break;
    for (lVar23 = 0; lVar23 != 0xc; lVar23 = lVar23 + 4) {
      if (3 < uVar11) {
        plVar19 = (long *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_418,"invalid value in C40 or Text segment",
                   (allocator<char> *)&codewordsInts);
        *plVar19 = (long)(plVar19 + 2);
        if (local_418 == &local_408) {
          *(uint *)(plVar19 + 2) = local_408;
          *(undefined4 *)((long)plVar19 + 0x14) = uStack_404;
          *(undefined4 *)(plVar19 + 3) = uStack_400;
          *(undefined4 *)((long)plVar19 + 0x1c) = uStack_3fc;
        }
        else {
          *plVar19 = (long)local_418;
          plVar19[2] = CONCAT44(uStack_404,local_408);
        }
        plVar19[1] = local_410;
        local_410 = 0;
        local_408 = local_408 & 0xffffff00;
        plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
        *(undefined2 *)(plVar19 + 5) = 0xb4;
        *(undefined1 *)((long)plVar19 + 0x2a) = 1;
        local_418 = &local_408;
        __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
      }
      uVar8 = *(uint *)((long)&triple_1.super__Optional_base<std::array<int,_3UL>,_true,_true>.
                               _M_payload.super__Optional_payload_base<std::array<int,_3UL>_>.
                               _M_payload + lVar23);
      switch(uVar11) {
      case 0:
        if (2 < (int)uVar8) {
          if (0x27 < uVar8) {
            plVar19 = (long *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3b8,"invalid value in C40 or Text segment",
                       (allocator<char> *)&codewordsInts);
            *plVar19 = (long)(plVar19 + 2);
            if (local_3b8 == &local_3a8) {
              *(uint *)(plVar19 + 2) = local_3a8;
              *(undefined4 *)((long)plVar19 + 0x14) = uStack_3a4;
              *(undefined4 *)(plVar19 + 3) = uStack_3a0;
              *(undefined4 *)((long)plVar19 + 0x1c) = uStack_39c;
            }
            else {
              *plVar19 = (long)local_3b8;
              plVar19[2] = CONCAT44(uStack_3a4,local_3a8);
            }
            plVar19[1] = local_3b0;
            local_3b0 = 0;
            local_3a8 = local_3a8 & 0xffffff00;
            plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
            *(undefined2 *)(plVar19 + 5) = 0xa1;
            *(undefined1 *)((long)plVar19 + 0x2a) = 1;
            local_3b8 = &local_3a8;
            __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
          }
          uVar6 = cVar25 * -0x80 + pcVar27[uVar8];
          break;
        }
        uVar11 = uVar8 + 1;
        goto LAB_001640e0;
      case 1:
        uVar6 = cVar25 * -0x80 + (char)uVar8;
        break;
      case 2:
        if (0x1b < (int)uVar8) {
          if (uVar8 != 0x1e) {
            plVar19 = (long *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3d8,"invalid value in C40 or Text segment",
                       (allocator<char> *)&codewordsInts);
            *plVar19 = (long)(plVar19 + 2);
            if (local_3d8 == &local_3c8) {
              *(uint *)(plVar19 + 2) = local_3c8;
              *(undefined4 *)((long)plVar19 + 0x14) = uStack_3c4;
              *(undefined4 *)(plVar19 + 3) = uStack_3c0;
              *(undefined4 *)((long)plVar19 + 0x1c) = uStack_3bc;
            }
            else {
              *plVar19 = (long)local_3d8;
              plVar19[2] = CONCAT44(uStack_3c4,local_3c8);
            }
            plVar19[1] = local_3d0;
            local_3d0 = 0;
            local_3c8 = local_3c8 & 0xffffff00;
            plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
            *(undefined2 *)(plVar19 + 5) = 0xaa;
            *(undefined1 *)((long)plVar19 + 0x2a) = 1;
            local_3d8 = &local_3c8;
            __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
          }
          cVar25 = '\x01';
          uVar11 = 0;
          goto LAB_001640e0;
        }
        puVar18 = DecodedBitStreamParser::C40_SHIFT2_SET_CHARS;
LAB_001640b5:
        uVar6 = cVar25 * -0x80 + puVar18[(int)uVar8];
        break;
      case 3:
        if (!bVar5) {
          if (0x1f < (int)uVar8) {
            plVar19 = (long *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3f8,"invalid value in C40 or Text segment",
                       (allocator<char> *)&codewordsInts);
            *plVar19 = (long)(plVar19 + 2);
            if (local_3f8 == &local_3e8) {
              *(uint *)(plVar19 + 2) = local_3e8;
              *(undefined4 *)((long)plVar19 + 0x14) = uStack_3e4;
              *(undefined4 *)(plVar19 + 3) = uStack_3e0;
              *(undefined4 *)((long)plVar19 + 0x1c) = uStack_3dc;
            }
            else {
              *plVar19 = (long)local_3f8;
              plVar19[2] = CONCAT44(uStack_3e4,local_3e8);
            }
            plVar19[1] = local_3f0;
            local_3f0 = 0;
            local_3e8 = local_3e8 & 0xffffff00;
            plVar19[4] = (long)"src/datamatrix/DMDecoder.cpp";
            *(undefined2 *)(plVar19 + 5) = 0xb2;
            *(undefined1 *)((long)plVar19 + 0x2a) = 1;
            local_3f8 = &local_3e8;
            __cxa_throw(plVar19,&Error::typeinfo,Error::~Error);
          }
          puVar18 = DecodedBitStreamParser::TEXT_SHIFT3_SET_CHARS;
          goto LAB_001640b5;
        }
        uVar6 = cVar25 * -0x80 + (char)uVar8 + '`';
      }
      uVar11 = 0;
      Content::push_back(&result,uVar6);
      cVar25 = '\0';
LAB_001640e0:
    }
  }
  uVar11 = uVar22 & 0xff;
  bVar5 = false;
  goto LAB_00163aa7;
}

Assistant:

static DecoderResult DoDecode(const BitMatrix& bits)
{
	// Construct a parser and read version, error-correction level
	const Version* version = VersionForDimensionsOf(bits);
	if (version == nullptr)
		return FormatError("Invalid matrix dimension");

	// Read codewords
	ByteArray codewords = CodewordsFromBitMatrix(bits, *version);
	if (codewords.empty())
		return FormatError("Invalid number of code words");

	bool fix259 = false; // see https://github.com/zxing-cpp/zxing-cpp/issues/259
retry:
	// Separate into data blocks
	std::vector<DataBlock> dataBlocks = GetDataBlocks(codewords, *version, fix259);
	if (dataBlocks.empty())
		return FormatError("Invalid number of data blocks");

	// Count total number of data bytes
	ByteArray resultBytes(TransformReduce(dataBlocks, 0, [](const auto& db) { return db.numDataCodewords; }));

	// Error-correct and copy data blocks together into a stream of bytes
	const int dataBlocksCount = Size(dataBlocks);
	for (int j = 0; j < dataBlocksCount; j++) {
		auto& [numDataCodewords, codewords] = dataBlocks[j];
		if (!CorrectErrors(codewords, numDataCodewords)) {
			if(version->versionNumber == 24 && !fix259) {
				fix259 = true;
				goto retry;
			}
			return ChecksumError();
		}

		for (int i = 0; i < numDataCodewords; i++) {
			// De-interlace data blocks.
			resultBytes[i * dataBlocksCount + j] = codewords[i];
		}
	}
#ifdef PRINT_DEBUG
	if (fix259)
		printf("-> needed retry with fix259 for 144x144 symbol\n");
#endif

	// Decode the contents of that stream of bytes
	return DecodedBitStreamParser::Decode(std::move(resultBytes), version->isDMRE())
		.setVersionNumber(version->versionNumber);
}